

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O1

string * __thiscall
cfd::js::api::TransactionStructApiBase::ConvertLockingScriptTypeString_abi_cxx11_
          (string *__return_storage_ptr__,TransactionStructApiBase *this,
          LockingScriptType script_type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "nonstandard";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "pubkey";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "pubkeyhash";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "scripthash";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "multisig";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "nulldata";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "witness_v0_scripthash";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "witness_v0_keyhash";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "witness_v1_taproot";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "witness_unknown";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "true";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "fee";
    pcVar1 = "";
    break;
  default:
    pcVar1 = "";
    pcVar2 = pcVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TransactionStructApiBase::ConvertLockingScriptTypeString(
    LockingScriptType script_type) {
  switch (script_type) {
    case LockingScriptType::kNonStandard:
      return "nonstandard";
    case LockingScriptType::kPayToPubkey:
      return "pubkey";
    case LockingScriptType::kPayToPubkeyHash:
      return "pubkeyhash";
    case LockingScriptType::kPayToScriptHash:
      return "scripthash";
    case LockingScriptType::kMultisig:
      return "multisig";
    case LockingScriptType::kNullData:
      return "nulldata";
    case LockingScriptType::kWitnessV0ScriptHash:
      return "witness_v0_scripthash";
    case LockingScriptType::kWitnessV0KeyHash:
      return "witness_v0_keyhash";
    case LockingScriptType::kWitnessV1Taproot:
      return "witness_v1_taproot";
    case LockingScriptType::kWitnessUnknown:
      return "witness_unknown";
    case LockingScriptType::kTrue:
      return "true";
#ifndef CFD_DISABLE_ELEMENTS
    case LockingScriptType::kFee:
      return "fee";
#endif  // CFD_DISABLE_ELEMENTS
    default:
      break;
  }
  return "";
}